

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer_combination_iterator.h
# Opt level: O3

void __thiscall
Gudhi::coxeter_triangulation::Integer_combination_iterator::increment
          (Integer_combination_iterator *this)

{
  pointer puVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  puVar1 = (this->value_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = this->k_;
  uVar6 = 0;
  do {
    uVar7 = uVar6;
    uVar6 = uVar7 + 1;
    if (puVar1[uVar7] != 0) break;
  } while (uVar7 < uVar8);
  puVar2 = (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = uVar6 & 0xffffffff;
  uVar9 = puVar1[uVar5];
  if (uVar9 == puVar2[uVar5]) {
    iVar3 = 0;
    uVar5 = uVar6 & 0xffffffff;
    do {
      if (uVar9 != 0) {
        iVar3 = iVar3 + puVar1[uVar7 & 0xffffffff];
        puVar1[uVar7 & 0xffffffff] = 0;
        uVar7 = uVar5;
      }
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
      uVar9 = puVar1[uVar5];
    } while (uVar9 == puVar2[uVar5]);
    uVar8 = this->k_;
    iVar3 = iVar3 + -1;
    uVar6 = (ulong)uVar4;
  }
  else {
    iVar3 = -1;
  }
  if ((uint)uVar6 < uVar8) {
    uVar4 = iVar3 + puVar1[uVar7 & 0xffffffff];
    puVar1[uVar7 & 0xffffffff] = 0;
    puVar1[uVar5] = puVar1[uVar5] + 1;
    uVar9 = *puVar2;
    if (uVar4 < uVar9) {
      uVar5 = 0;
    }
    else {
      uVar6 = 0;
      uVar7 = 1;
      do {
        uVar5 = uVar7;
        puVar1[uVar6] = uVar9;
        uVar4 = uVar4 - puVar2[uVar6];
        uVar9 = puVar2[uVar5];
        uVar6 = uVar5;
        uVar7 = (ulong)((int)uVar5 + 1);
      } while (uVar9 <= uVar4);
    }
    puVar1[uVar5] = uVar4;
    return;
  }
  this->is_end_ = true;
  return;
}

Assistant:

void increment() {
    uint j1 = 0;
    uint s = 0;
    while (value_[j1] == 0 && j1 < k_) j1++;
    uint j2 = j1 + 1;
    while (value_[j2] == bounds_[j2]) {
      if (bounds_[j2] != 0) {
        s += value_[j1];
        value_[j1] = 0;
        j1 = j2;
      }
      j2++;
    }
    if (j2 >= k_) {
      is_end_ = true;
      return;
    }
    s += value_[j1] - 1;
    value_[j1] = 0;
    value_[j2]++;
    uint i = 0;
    while (s >= bounds_[i]) {
      value_[i] = bounds_[i];
      s -= bounds_[i];
      i++;
    }
    value_[i++] = s;
  }